

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void select_test(void)

{
  uint64_t *puVar1;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  bitset_container_t *container;
  uint16_t value;
  ulong uVar5;
  ulong uVar6;
  uint16_t value_1;
  unsigned_long b;
  uint32_t element;
  uint32_t local_34;
  
  container = bitset_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x129);
  puVar1 = container->words;
  iVar4 = container->cardinality;
  for (uVar5 = 0x1b; (uint)uVar5 < 0xe3; uVar5 = (ulong)((uint)uVar5 + 5)) {
    uVar2 = puVar1[uVar5 >> 6];
    uVar6 = uVar2 | 1L << (uVar5 & 0x3f);
    iVar4 = iVar4 + (int)((uVar2 ^ uVar6) >> ((byte)uVar5 & 0x3f));
    puVar1[uVar5 >> 6] = uVar6;
  }
  container->cardinality = iVar4;
  _element = 0;
  iVar4 = 0;
  for (b = 0x1b; _element = CONCAT44(0xc,element), (int)b != 0xe3; b = b + 5) {
    _Var3 = bitset_container_select(container,&local_34,iVar4 + 0xc,&element);
    _assert_true((ulong)_Var3,"bitset_container_select(B, &start_rank, i + 12, &element)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x133);
    _assert_int_equal(_element & 0xffffffff,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x134);
    iVar4 = iVar4 + 1;
  }
  _Var3 = bitset_container_select(container,&local_34,0x34,&element);
  _assert_true((ulong)!_Var3,"bitset_container_select(B, &start_rank, i + 12, &element)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x138);
  _assert_int_equal(_element >> 0x20,0x34,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x139);
  bitset_container_free(container);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        bitset_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(bitset_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(bitset_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    bitset_container_free(B);
}